

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QNetworkInformationBackendFactory_*>::begin(QList<QNetworkInformationBackendFactory_*> *this)

{
  QNetworkInformationBackendFactory **n;
  QArrayDataPointer<QNetworkInformationBackendFactory_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QNetworkInformationBackendFactory_*> *)0x236129);
  QArrayDataPointer<QNetworkInformationBackendFactory_*>::operator->(in_RDI);
  n = QArrayDataPointer<QNetworkInformationBackendFactory_*>::begin
                ((QArrayDataPointer<QNetworkInformationBackendFactory_*> *)0x23613a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }